

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O0

void gen_op_evlwwsplat(DisasContext_conflict10 *ctx,TCGv_i64 addr)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 val;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 addr_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  val = tcg_temp_new_i64(tcg_ctx_00);
  gen_qemu_ld32u(ctx,val,addr);
  uVar1 = rD(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gprh[uVar1],val);
  uVar1 = rD(ctx->opcode);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],val);
  tcg_temp_free_i64(tcg_ctx_00,val);
  return;
}

Assistant:

static inline void gen_op_evlwwsplat(DisasContext *ctx, TCGv addr)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_qemu_ld32u(ctx, t0, addr);
    tcg_gen_mov_tl(tcg_ctx, cpu_gprh[rD(ctx->opcode)], t0);
    tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);
    tcg_temp_free(tcg_ctx, t0);
}